

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O2

void NULLC::TraceLabel(char *str)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  
  lVar2 = traceContext;
  sVar4 = strlen(str);
  uVar5 = (int)sVar4 + 1;
  uVar3 = *(uint *)(lVar2 + 0x264);
  if ((uVar3 <= *(int *)(lVar2 + 0x260) + uVar5) ||
     (*(int *)(lVar2 + 0x270) == *(int *)(lVar2 + 0x274))) {
    TraceDump();
    uVar3 = *(uint *)(lVar2 + 0x264);
  }
  if (uVar5 < uVar3) {
    uVar3 = *(uint *)(lVar2 + 0x260);
    memcpy((void *)((ulong)uVar3 + *(long *)(lVar2 + 0x268)),str,(ulong)uVar5);
    *(int *)(lVar2 + 0x260) = *(int *)(lVar2 + 0x260) + uVar5;
    lVar1 = *(long *)(lVar2 + 0x278);
    uVar5 = *(uint *)(lVar2 + 0x270);
    *(uint *)(lVar2 + 0x270) = uVar5 + 1;
    *(uint *)(lVar1 + (ulong)uVar5 * 8) = uVar3 * 4 + 2;
    *(undefined4 *)(lVar1 + 4 + (ulong)uVar5 * 8) = 0;
    return;
  }
  __assert_fail("count < context.labels.max",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h",
                0x127,"void NULLC::TraceLabel(const char *)");
}

Assistant:

inline void TraceLabel(const char *str)
	{
		TraceContext &context = *traceContext;

		unsigned count = unsigned(strlen(str)) + 1;

		if(context.labels.count + count >= context.labels.max || context.events.count == context.events.max)
			TraceDump();

		assert(count < context.labels.max);

		unsigned token = context.labels.count;

		memcpy(&context.labels.data[context.labels.count], str, count);
		context.labels.count += count;

		TraceEvent &traceEvent = context.events.data[context.events.count++];

		traceEvent.isEnter = false;
		traceEvent.isLabel = true;
		traceEvent.token = token;
		traceEvent.ts = 0;
	}